

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O2

void __thiscall mjs::regexp_object::fixup(regexp_object *this)

{
  gc_heap *old_heap;
  
  old_heap = (this->super_native_object).super_object.heap_;
  gc_heap_ptr_untracked<mjs::global_object,_true>::fixup
            ((gc_heap_ptr_untracked<mjs::global_object,_true> *)
             &(this->super_native_object).field_0x24,old_heap);
  gc_heap_ptr_untracked<mjs::gc_string,_true>::fixup(&this->source_,old_heap);
  value_representation::fixup(&this->last_index_,old_heap);
  native_object::fixup(&this->super_native_object);
  return;
}

Assistant:

void fixup() {
        auto& h = heap();
        global_.fixup(h);
        source_.fixup(h);
        last_index_.fixup(h);
        native_object::fixup();
    }